

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O3

Token * __thiscall
wabt::WastLexer::GetNumberToken(Token *__return_storage_ptr__,WastLexer *this,TokenType token_type)

{
  byte *pbVar1;
  bool bVar2;
  ReservedChars RVar3;
  byte *pbVar4;
  LiteralType literal_type;
  byte *pbVar5;
  long lVar6;
  
  bVar2 = ReadNum(this);
  if (bVar2) {
    pbVar5 = (byte *)this->buffer_end_;
    pbVar4 = (byte *)this->cursor_;
    if ((pbVar4 < pbVar5) && (*pbVar4 == 0x2e)) {
      pbVar4 = pbVar4 + 1;
      this->cursor_ = (char *)pbVar4;
      if (pbVar4 < pbVar5) {
        lVar6 = (ulong)*pbVar4 + 1;
      }
      else {
        lVar6 = 0;
      }
      token_type = First_Literal;
      if ((""[lVar6] & 8U) != 0) {
        bVar2 = ReadNum(this);
        if (!bVar2) goto LAB_0017d57e;
        pbVar5 = (byte *)this->buffer_end_;
        pbVar4 = (byte *)this->cursor_;
      }
    }
    if ((pbVar4 < pbVar5) && ((*pbVar4 == 0x65 || (*pbVar4 == 0x45)))) {
      pbVar1 = pbVar4 + 1;
      this->cursor_ = (char *)pbVar1;
      if ((pbVar1 < pbVar5) && ((*pbVar1 == 0x2d || (*pbVar1 == 0x2b)))) {
        this->cursor_ = (char *)(pbVar4 + 2);
      }
      bVar2 = ReadNum(this);
      RVar3 = ReadReservedChars(this);
      if (!bVar2) goto LAB_0017d586;
      if (RVar3 != None) goto LAB_0017d57e;
LAB_0017d5a5:
      token_type = First_Literal;
      literal_type = Float;
    }
    else {
      RVar3 = ReadReservedChars(this);
      if (RVar3 != None) goto LAB_0017d57e;
      if (token_type == First_Literal) goto LAB_0017d5a5;
      literal_type = Int;
    }
    LiteralToken(__return_storage_ptr__,this,token_type,literal_type);
  }
  else {
LAB_0017d57e:
    ReadReservedChars(this);
LAB_0017d586:
    TextToken(__return_storage_ptr__,this,Reserved,0);
  }
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::GetNumberToken(TokenType token_type) {
  if (ReadNum()) {
    if (MatchChar('.')) {
      token_type = TokenType::Float;
      if (IsDigit(PeekChar()) && !ReadNum()) {
        return GetReservedToken();
      }
    }
    if (MatchChar('e') || MatchChar('E')) {
      token_type = TokenType::Float;
      ReadSign();
      if (!ReadNum()) {
        return GetReservedToken();
      }
    }
    if (NoTrailingReservedChars()) {
      if (token_type == TokenType::Float) {
        return LiteralToken(token_type, LiteralType::Float);
      } else {
        return LiteralToken(token_type, LiteralType::Int);
      }
    }
  }
  return GetReservedToken();
}